

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x19e6da8;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrix::TPZStructMatrix((TPZStructMatrix *)this,&PTR_construction_vtable_104__019e63b0);
  *(undefined8 *)&this->field_0xb0 = 0x19e6880;
  *(undefined8 *)this = 0x19e67a0;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__019e63d8);
  *(undefined8 *)&this->field_0xb0 = 0x19e6330;
  *(undefined8 *)this = 0x19e6170;
  *(undefined8 *)&this->field_0xa0 = 0x19e6230;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}